

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O3

bool AString_replaceCString
               (AString *str,char *old,size_t oldLen,char *rep,size_t newLen,size_t count)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  char *cstr;
  void *__dest;
  size_t sVar4;
  size_t sVar5;
  size_t index;
  
  bVar3 = false;
  if (oldLen != 0 && (old != (char *)0x0 && str != (AString *)0x0)) {
    if (rep == (char *)0x0) {
      newLen = 0;
    }
    cstr = "";
    if (rep != (char *)0x0) {
      cstr = rep;
    }
    sVar1 = str->size;
    sVar2 = str->capacity;
    __dest = malloc(sVar2 + 1);
    memcpy(__dest,str->buffer,sVar1 + 1);
    if (sVar1 != 0) {
      index = 0;
      sVar5 = 0;
      do {
        if (str->buffer[index] == old[sVar5]) {
          sVar4 = sVar5 + 1;
          if (sVar4 == oldLen) {
            index = index - sVar5;
            bVar3 = AString_replaceRangeCString(str,index,oldLen,cstr,newLen);
            if (bVar3 == false) {
              str->capacity = sVar2;
              str->size = sVar1;
              memcpy(str->buffer,__dest,sVar1 + 1);
              bVar3 = false;
              goto LAB_001529a0;
            }
            if (count != 0) {
              count = count - 1;
              if (count != 0) goto LAB_0015297f;
              break;
            }
            sVar4 = 0;
            count = 0;
          }
        }
        else {
LAB_0015297f:
          sVar4 = 0;
        }
        index = index + 1;
        sVar5 = sVar4;
      } while (index < str->size);
    }
    bVar3 = true;
LAB_001529a0:
    free(__dest);
  }
  return bVar3;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceCString(struct AString *str, const char *old, size_t oldLen, const char *rep, size_t newLen, size_t count)
{
    size_t i, currentOldIndex = 0, tmpSize, tmpCapacity;
    char *tmp;
    if(str == nullptr || old == nullptr || oldLen == 0) {
        return false;
    } else if(rep == nullptr) {
        rep = "";
        newLen = 0;
    }
    tmpSize = str->size;
    tmpCapacity = str->capacity;
    tmp = (char*) malloc(tmpCapacity + 1);
    memcpy(tmp, str->buffer, tmpSize + 1);
    for(i = 0; i < str->size; ++i) {
        char c = str->buffer[i];
        if(c == old[currentOldIndex]) {
            if(++currentOldIndex == oldLen) {
                i -= currentOldIndex - 1;
                if(!AString_replaceRangeCString(str, i, currentOldIndex, rep, newLen)) {
                    str->capacity = tmpCapacity;
                    str->size = tmpSize;
                    memcpy(str->buffer, tmp, tmpSize + 1);
                    free(tmp);
                    return false;
                }
                if(count > 0 && --count == 0)
                    goto RETURN;
                currentOldIndex = 0;
            }
        } else {
            currentOldIndex = 0;
        }
    }
    RETURN:
    free(tmp);
    return true;
}